

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFStream.cpp
# Opt level: O0

void __thiscall adios2::transport::FileFStream::CheckFile(FileFStream *this,string *hint)

{
  ulong uVar1;
  long in_RDI;
  allocator local_91;
  string local_90 [36];
  int in_stack_ffffffffffffff94;
  string *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb0;
  allocator local_31;
  string local_30 [48];
  
  uVar1 = std::ios::operator!((ios *)(in_RDI + 0xf0 + *(long *)(*(long *)(in_RDI + 0xf0) + -0x18)));
  if ((uVar1 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Toolkit",&local_31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff98,"transport::file::FileFStream",
               (allocator *)&stack0xffffffffffffff97);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"CheckFile",&local_91);
    helper::Throw<std::ios_base::failure[abi:cxx11]>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return;
}

Assistant:

void FileFStream::CheckFile(const std::string hint) const
{
    if (!m_FileStream)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileFStream",
                                              "CheckFile", hint);
    }
}